

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O1

void __thiscall Tracker::begin(Tracker *this,string *_track)

{
  iterator iVar1;
  rep rVar2;
  mapped_type *pmVar3;
  
  if (this->m_running == true) {
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>_>
            ::find(&(this->m_data)._M_t,_track);
    if ((_Rb_tree_header *)iVar1._M_node == &(this->m_data)._M_t._M_impl.super__Rb_tree_header) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->m_tracks,_track);
    }
    rVar2 = std::chrono::_V2::system_clock::now();
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>_>
             ::operator[](&this->m_data,_track);
    (pmVar3->start).__d.__r = rVar2;
  }
  return;
}

Assistant:

void Tracker::begin(const std::string& _track) {
    if (!m_running)
        return;

    if ( m_data.find(_track) == m_data.end() )
        m_tracks.push_back(_track);

    m_data[_track].start = std::chrono::high_resolution_clock::now();
}